

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage destImage)

{
  pointer *this_00;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  RefData<vk::Handle<(vk::HandleType)6>_> data_03;
  bool bVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  VkResult VVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  VkDevice device;
  DeviceInterface *vk_00;
  VkQueue pVVar12;
  pointer pvVar13;
  Handle<(vk::HandleType)8> *pHVar14;
  Allocation *pAVar15;
  VkDeviceSize VVar16;
  Handle<(vk::HandleType)24> *pHVar17;
  void *pvVar18;
  TextureLayerData *pTVar19;
  const_reference this_01;
  ConstPixelBufferAccess *pCVar20;
  const_reference this_02;
  TextureFormat *pTVar21;
  IVec3 *size;
  VkDeviceMemory memory;
  VkCommandBuffer_s **ppVVar22;
  size_type sVar23;
  VkBufferImageCopy *pVVar24;
  Handle<(vk::HandleType)6> *pHVar25;
  MovePtr *this_03;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined8 uStack_4d8;
  VkSubmitInfo submitInfo;
  undefined1 local_478 [8];
  VkBufferImageCopy layerRegion;
  PixelBufferAccess destAccess;
  ConstPixelBufferAccess *access_1;
  size_t layerNdx;
  TextureLayerData *layerData;
  size_t levelNdx;
  deUint8 *destPtr;
  undefined8 uStack_3e8;
  deUint32 layerDataOffset;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined4 local_3c0 [2];
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  VkBufferMemoryBarrier preBufferBarrier;
  RefData<vk::Handle<(vk::HandleType)6>_> local_2d8;
  deUint64 local_2b8;
  Move<vk::VkCommandBuffer_s_*> local_2b0;
  RefData<vk::VkCommandBuffer_s_*> local_290;
  Move<vk::Handle<(vk::HandleType)24>_> local_270;
  RefData<vk::Handle<(vk::HandleType)24>_> local_250;
  deUint64 local_230;
  deUint64 local_228;
  undefined4 local_21c;
  deUint64 local_218;
  VkMemoryRequirements local_210;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_1f8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_1e8;
  Move<vk::Handle<(vk::HandleType)8>_> local_1d8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_1b8;
  undefined1 local_198 [8];
  VkBufferCreateInfo bufferParams;
  ConstPixelBufferAccess *access;
  __normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
  local_150;
  const_iterator lit;
  __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
  local_140;
  const_iterator mit;
  undefined1 local_130 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_90 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  deUint32 bufferSize;
  VkImageAspectFlags aspectMask;
  bool isShadowSampler;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *vk;
  VkDevice vkDevice;
  deUint32 arrayLayers_local;
  deUint32 mipLevels_local;
  Sampler *refSampler_local;
  TextureData *textureData_local;
  TextureFormat *texFormat_local;
  ShaderRenderCaseInstance *this_local;
  VkImage destImage_local;
  
  device = getDevice(this);
  vk_00 = getDeviceInterface(this);
  pVVar12 = getUniversalQueue(this);
  dVar4 = getUniversalQueueFamilyIndex(this);
  dVar5 = (refSampler->compare != COMPAREMODE_NONE) + 1;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ = 0;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move
            ((Move<vk::VkCommandBuffer_s_*> *)
             &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
             &offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130);
  mit._M_current._4_4_ = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,
             (value_type_conflict1 *)((long)&mit._M_current + 4));
  mit._M_current._0_4_ = tcu::TextureFormat::getPixelSize(texFormat);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,
             (value_type_conflict1 *)&mit);
  local_140._M_current =
       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
       std::
       vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
       ::begin(textureData);
  while( true ) {
    lit._M_current =
         (ConstPixelBufferAccess *)
         std::
         vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
         ::end(textureData);
    bVar3 = __gnu_cxx::operator!=
                      (&local_140,
                       (__normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
                        *)&lit);
    if (!bVar3) break;
    pvVar13 = __gnu_cxx::
              __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
              ::operator->(&local_140);
    local_150._M_current =
         (ConstPixelBufferAccess *)
         std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
         begin(pvVar13);
    while( true ) {
      pvVar13 = __gnu_cxx::
                __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
                ::operator->(&local_140);
      access = (ConstPixelBufferAccess *)
               std::
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
               end(pvVar13);
      bVar3 = __gnu_cxx::operator!=
                        (&local_150,
                         (__normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
                          *)&access);
      if (!bVar3) break;
      bufferParams.pQueueFamilyIndices =
           (deUint32 *)
           __gnu_cxx::
           __normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
           ::operator*(&local_150);
      dVar6 = sr::anon_unknown_0::getNextMultiple
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,
                         (deUint32)
                         buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                         m_allocator);
      iVar8 = tcu::ConstPixelBufferAccess::getWidth
                        ((ConstPixelBufferAccess *)bufferParams.pQueueFamilyIndices);
      iVar9 = tcu::ConstPixelBufferAccess::getHeight
                        ((ConstPixelBufferAccess *)bufferParams.pQueueFamilyIndices);
      iVar10 = tcu::ConstPixelBufferAccess::getDepth
                         ((ConstPixelBufferAccess *)bufferParams.pQueueFamilyIndices);
      pTVar21 = tcu::ConstPixelBufferAccess::getFormat
                          ((ConstPixelBufferAccess *)bufferParams.pQueueFamilyIndices);
      iVar11 = tcu::TextureFormat::getPixelSize(pTVar21);
      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ =
           iVar8 * iVar9 * iVar10 * iVar11 + dVar6;
      __gnu_cxx::
      __normal_iterator<const_tcu::ConstPixelBufferAccess_*,_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>
      ::operator++(&local_150);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_*,_std::vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>_>
    ::operator++(&local_140);
  }
  local_198._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferParams._4_4_ = 0;
  bufferParams.pNext._0_4_ = 0;
  bufferParams._16_8_ =
       ZEXT48((deUint32)
              buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator);
  bufferParams.size._0_4_ = 1;
  bufferParams.size._4_4_ = 0;
  bufferParams.usage = 0;
  bufferParams.queueFamilyIndexCount = 0;
  bufferParams._44_4_ = 0;
  ::vk::createBuffer(&local_1d8,vk_00,device,(VkBufferCreateInfo *)local_198,
                     (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&local_1d8);
  uVar26 = SUB84(local_1b8.deleter.m_deviceIface,0);
  uVar27 = (undefined4)((ulong)local_1b8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_deviceIface._0_4_ = uVar26;
  data_00.object.m_internal = local_1b8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = uVar27;
  data_00.deleter.m_device = local_1b8.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_1b8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_1d8);
  this_03 = (MovePtr *)this->m_memAlloc;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  local_218 = pHVar14->m_internal;
  ::vk::getBufferMemoryRequirements(&local_210,vk_00,device,(VkBuffer)local_218);
  local_21c = ::vk::MemoryRequirement::HostVisible;
  (**(code **)(*(long *)this_03 + 0x18))
            (&local_1f8,this_03,&local_210,::vk::MemoryRequirement::HostVisible);
  local_1e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_1f8,this_03);
  data._8_4_ = uVar26;
  data.ptr = (Allocation *)local_1b8.object.m_internal;
  data._12_4_ = uVar27;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1f8);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  local_228 = pHVar14->m_internal;
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  local_230 = (deUint64)::vk::Allocation::getMemory(pAVar15);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  VVar16 = ::vk::Allocation::getOffset(pAVar15);
  VVar7 = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,local_228,local_230,VVar16);
  ::vk::checkResult(VVar7,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x440);
  ::vk::createCommandPool(&local_270,vk_00,device,1,dVar4,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_250,(Move *)&local_270);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_250.deleter.m_deviceIface;
  data_01.object.m_internal = local_250.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_250.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_250.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_250.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_250.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_270);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                       &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  local_2b8 = pHVar17->m_internal;
  ::vk::allocateCommandBuffer
            (&local_2b0,vk_00,device,(VkCommandPool)local_2b8,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_290,(Move *)&local_2b0);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_290.deleter.m_deviceIface;
  data_02.object = local_290.object;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_290.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_290.deleter.m_device;
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_290.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_290.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=
            ((Move<vk::VkCommandBuffer_s_*> *)
             &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,data_02
            );
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_2b0);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&preBufferBarrier.size,vk_00,device,0,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&preBufferBarrier.size);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_2d8.deleter.m_deviceIface;
  data_03.object.m_internal = local_2d8.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_2d8.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_2d8.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_2d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&preBufferBarrier.size);
  preImageBarrier.subresourceRange.layerCount = 0x2c;
  preBufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  preBufferBarrier._4_4_ = 0;
  preBufferBarrier.pNext._0_4_ = 0x4000;
  preBufferBarrier.pNext._4_4_ = 0x800;
  preBufferBarrier.srcAccessMask = 0xffffffff;
  preBufferBarrier.dstAccessMask = 0xffffffff;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  preBufferBarrier._24_8_ = pHVar14->m_internal;
  preBufferBarrier.buffer.m_internal = 0;
  preBufferBarrier.offset =
       (VkDeviceSize)
       (deUint32)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  postImageBarrier.subresourceRange.layerCount = 0x2d;
  preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  preImageBarrier._4_4_ = 0;
  preImageBarrier.pNext._0_4_ = 0;
  preImageBarrier.pNext._4_4_ = 0x1000;
  preImageBarrier.srcAccessMask = 0;
  preImageBarrier.dstAccessMask = 7;
  preImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  preImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  preImageBarrier._32_8_ = destImage.m_internal;
  preImageBarrier.image.m_internal._4_4_ = 0;
  preImageBarrier.subresourceRange.baseMipLevel = 0;
  local_3c0[0] = 0x2d;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext._0_4_ = 0x1000;
  postImageBarrier.pNext._4_4_ = 0x20;
  postImageBarrier.srcAccessMask = 7;
  postImageBarrier.dstAccessMask = 5;
  postImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier._32_8_ = destImage.m_internal;
  postImageBarrier.image.m_internal._4_4_ = 0;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  cmdBufferBeginInfo.pNext = (void *)0x1;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  uStack_3e8 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  destPtr._4_4_ = 0;
  postImageBarrier.image.m_internal._0_4_ = dVar5;
  postImageBarrier.subresourceRange.aspectMask = mipLevels;
  postImageBarrier.subresourceRange.levelCount = arrayLayers;
  preImageBarrier.image.m_internal._0_4_ = dVar5;
  preImageBarrier.subresourceRange.aspectMask = mipLevels;
  preImageBarrier.subresourceRange.levelCount = arrayLayers;
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  pvVar18 = ::vk::Allocation::getHostPtr(pAVar15);
  layerData = (TextureLayerData *)0x0;
  while( true ) {
    pTVar19 = (TextureLayerData *)
              std::
              vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              ::size(textureData);
    if (pTVar19 <= layerData) break;
    this_01 = std::
              vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              ::operator[](textureData,(size_type)layerData);
    access_1 = (ConstPixelBufferAccess *)0x0;
    while( true ) {
      pCVar20 = (ConstPixelBufferAccess *)
                std::
                vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
                size(this_01);
      if (pCVar20 <= access_1) break;
      dVar4 = sr::anon_unknown_0::getNextMultiple
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,
                         destPtr._4_4_);
      this_02 = std::
                vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
                operator[](this_01,(size_type)access_1);
      pTVar21 = tcu::ConstPixelBufferAccess::getFormat(this_02);
      size = tcu::ConstPixelBufferAccess::getSize(this_02);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&layerRegion.imageExtent.height,pTVar21,size,
                 (void *)((long)pvVar18 + (ulong)dVar4));
      local_478 = (undefined1  [8])(ulong)dVar4;
      layerRegion.bufferOffset._0_4_ = tcu::ConstPixelBufferAccess::getWidth(this_02);
      layerRegion.bufferOffset._4_4_ = tcu::ConstPixelBufferAccess::getHeight(this_02);
      layerRegion.bufferImageHeight = (deUint32)layerData;
      layerRegion.imageSubresource.aspectMask = (VkImageAspectFlags)access_1;
      layerRegion.imageSubresource.mipLevel = 1;
      layerRegion.imageSubresource.baseArrayLayer = 0;
      layerRegion.imageSubresource.layerCount = 0;
      layerRegion.imageOffset.x = 0;
      layerRegion.bufferRowLength = dVar5;
      layerRegion.imageOffset.y = tcu::ConstPixelBufferAccess::getWidth(this_02);
      layerRegion.imageOffset.z = tcu::ConstPixelBufferAccess::getHeight(this_02);
      layerRegion.imageExtent.width = tcu::ConstPixelBufferAccess::getDepth(this_02);
      std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
                ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                 &offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_478);
      tcu::copy((EVP_PKEY_CTX *)&layerRegion.imageExtent.height,(EVP_PKEY_CTX *)this_02);
      iVar8 = tcu::ConstPixelBufferAccess::getWidth(this_02);
      iVar9 = tcu::ConstPixelBufferAccess::getHeight(this_02);
      iVar10 = tcu::ConstPixelBufferAccess::getDepth(this_02);
      pTVar21 = tcu::ConstPixelBufferAccess::getFormat(this_02);
      iVar11 = tcu::TextureFormat::getPixelSize(pTVar21);
      destPtr._4_4_ = iVar8 * iVar9 * iVar10 * iVar11 + dVar4;
      access_1 = (ConstPixelBufferAccess *)((long)&(access_1->m_format).order + 1);
    }
    layerData = (TextureLayerData *)
                ((long)&(layerData->
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  memory = ::vk::Allocation::getMemory(pAVar15);
  pAVar15 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  VVar16 = ::vk::Allocation::getOffset(pAVar15);
  ::vk::flushMappedMemoryRange
            (vk_00,device,memory,VVar16,
             (ulong)(deUint32)
                    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator)
  ;
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                         m_allocator);
  VVar7 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar22,&stack0xfffffffffffffc18);
  ::vk::checkResult(VVar7,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4b6);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                         m_allocator);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar22,0x4000,0x1000,0,0,0,1,&preImageBarrier.subresourceRange.layerCount,1,
             &postImageBarrier.subresourceRange.layerCount);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                         m_allocator);
  pVVar1 = *ppVVar22;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &bufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  dVar2 = pHVar14->m_internal;
  submitInfo.pSignalSemaphores = (VkSemaphore *)destImage.m_internal;
  this_00 = &offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  sVar23 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::size
                     ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                      this_00);
  pVVar24 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::data
                      ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                       this_00);
  (*vk_00->_vptr_DeviceInterface[0x62])
            (vk_00,pVVar1,dVar2,submitInfo.pSignalSemaphores,7,sVar23 & 0xffffffff,pVVar24);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                         m_allocator);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar22,0x1000,1,0,0,0,0,0,1,local_3c0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                         m_allocator);
  VVar7 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar22);
  ::vk::checkResult(VVar7,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ba);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_4d8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)
                  &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                       &copyRegions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  VVar7 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar12,1,&uStack_4d8,pHVar25->m_internal);
  ::vk::checkResult(VVar7,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4c9);
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                       &copyRegions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  VVar7 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar25,1,0xffffffffffffffff);
  ::vk::checkResult(VVar7,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ca);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130);
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
             &offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)
             &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_90);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  return;
}

Assistant:

void ShaderRenderCaseInstance::uploadImage (const tcu::TextureFormat&			texFormat,
											const TextureData&					textureData,
											const tcu::Sampler&					refSampler,
											deUint32							mipLevels,
											deUint32							arrayLayers,
											VkImage								destImage)
{
	const VkDevice					vkDevice				= getDevice();
	const DeviceInterface&			vk						= getDeviceInterface();
	const VkQueue					queue					= getUniversalQueue();
	const deUint32					queueFamilyIndex		= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	deUint32						bufferSize				= 0u;
	Move<VkBuffer>					buffer;
	de::MovePtr<Allocation>			bufferAlloc;
	Move<VkCommandPool>				cmdPool;
	Move<VkCommandBuffer>			cmdBuffer;
	Move<VkFence>					fence;
	std::vector<VkBufferImageCopy>	copyRegions;
	std::vector<deUint32>			offsetMultiples;

	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	// Create source buffer
	{
		const VkBufferCreateInfo bufferParams =
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			0u,											// deUint32				queueFamilyIndexCount;
			DE_NULL,									// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Create command pool and buffer
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	fence = createFence(vk, vkDevice);

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// deUint32						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// deUint32						commandBufferCount;
		&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
		0u,								// deUint32						signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
}